

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void print_two_dimensions(int (*nums) [5],int rows,int cols)

{
  int c;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (cols < 1) {
    cols = 0;
  }
  uVar3 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar3 = 0;
  }
  for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; (uint)cols != uVar1; uVar1 = uVar1 + 1) {
      printf("%i ",(ulong)(uint)(*nums)[uVar1]);
    }
    nums = nums + 1;
  }
  putchar(10);
  return;
}

Assistant:

void print_two_dimensions(int nums[][5], int rows, int cols) {
    for (int r=0; r<rows; r++) {
        for (int c=0; c<cols; c++) {
            printf("%i ", nums[r][c]);
        }
    }
    printf("\n");
}